

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O2

QFunctionPointer anon_unknown.dwarf_198e1a8::getProcAddress(QOpenGLContext *context,char *funcName)

{
  long lVar1;
  QFunctionPointer p_Var2;
  size_t sVar3;
  long lVar4;
  long in_FS_OFFSET;
  char fn [512];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = QOpenGLContext::getProcAddress(context,funcName);
  if (p_Var2 == (QFunctionPointer)0x0) {
    memset(fn,0xaa,0x200);
    sVar3 = strlen(funcName);
    __memcpy_chk(fn,funcName,sVar3,0x200);
    lVar4 = 8;
    do {
      p_Var2 = (QFunctionPointer)0x0;
      if (lVar4 == 0x58) break;
      memcpy(fn + sVar3,*(void **)(&UNK_00787f58 + lVar4),
             (long)*(int *)((long)&getProcAddress::extensions[0].name + lVar4));
      p_Var2 = QOpenGLContext::getProcAddress(context,fn);
      lVar4 = lVar4 + 0x10;
    } while (p_Var2 == (QFunctionPointer)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return p_Var2;
}

Assistant:

static QFunctionPointer getProcAddress(QOpenGLContext *context, const char *funcName)
{
    QFunctionPointer function = context->getProcAddress(funcName);

    static const struct {
        const char *name;
        int len; // includes trailing \0
    } extensions[] = {
        { "ARB", 4 },
        { "OES", 4 },
        { "EXT", 4 },
        { "ANGLE", 6 },
        { "NV", 3 },
    };

    if (!function) {
        char fn[512];
        size_t size = strlen(funcName);
        Q_ASSERT(size < 500);
        memcpy(fn, funcName, size);
        char *ext = fn + size;

        for (const auto &e : extensions) {
            memcpy(ext, e.name, e.len);
            function = context->getProcAddress(fn);
            if (function)
                break;
        }
    }

    return function;
}